

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

parse_return __thiscall
msgpack::v2::detail::
context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::
after_visit_proc(context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
                 *this,bool visit_result,size_t *off)

{
  byte bVar1;
  parse_helper<msgpack::v2::detail::create_object_visitor> *in_RDX;
  byte in_SIL;
  context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_> *in_RDI;
  parse_return ret;
  undefined7 in_stack_ffffffffffffffe8;
  parse_return local_4;
  
  bVar1 = in_SIL & 1;
  in_RDI->m_current = in_RDI->m_current + 1;
  if (bVar1 == 0) {
    (in_RDX->
    super_context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>).
    m_start = in_RDI->m_current + -(long)in_RDI->m_start;
    local_4 = PARSE_STOP_VISITOR;
  }
  else {
    holder(in_RDI);
    local_4 = unpack_stack::consume
                        ((unpack_stack *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),in_RDX);
    if (local_4 != PARSE_CONTINUE) {
      (in_RDX->
      super_context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>)
      .m_start = in_RDI->m_current + -(long)in_RDI->m_start;
    }
    in_RDI->m_cs = 0;
  }
  return local_4;
}

Assistant:

parse_return after_visit_proc(bool visit_result, std::size_t& off) {
        ++m_current;
        if (!visit_result) {
            off = static_cast<std::size_t>(m_current - m_start);
            return PARSE_STOP_VISITOR;
        }
        parse_return ret = m_stack.consume(holder());
        if (ret != PARSE_CONTINUE) {
            off = static_cast<std::size_t>(m_current - m_start);
        }
        m_cs = MSGPACK_CS_HEADER;
        return ret;
    }